

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.h
# Opt level: O2

void __thiscall
embree::VerifyApplication::IntersectTest::IntersectTest
          (IntersectTest *this,string *name,int sse2,IntersectMode imode,IntersectVariant ivariant,
          TestType ty)

{
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  Test::Test(&this->super_Test,&local_50,sse2,ty,true);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Test).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Test_00248d10;
  this->imode = imode;
  this->ivariant = ivariant;
  return;
}

Assistant:

IntersectTest (std::string name, int isa, IntersectMode imode, IntersectVariant ivariant, TestType ty = TEST_SHOULD_PASS)
        : Test(name,isa,ty), imode(imode), ivariant(ivariant) {}